

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O1

int s2_semi_mgau_frame_eval
              (ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,int32 n_senone_active,
              mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  short sVar8;
  undefined4 uVar9;
  mfcc_t *pmVar10;
  char *pcVar11;
  undefined8 *puVar12;
  int *piVar13;
  float *pfVar14;
  int *piVar15;
  ps_mgaufuncs_t *ppVar16;
  char *pcVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  byte bVar21;
  int *piVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  byte bVar27;
  byte bVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  byte bVar41;
  ulong uVar42;
  int iVar43;
  int iVar44;
  float *pfVar45;
  uint uVar46;
  int iVar47;
  long lVar48;
  float fVar49;
  float fVar50;
  uint8 w_den [16];
  byte abStack_b8 [16];
  byte abStack_a8 [16];
  byte abStack_98 [16];
  byte abStack_88 [16];
  byte abStack_78 [16];
  byte abStack_68 [20];
  int local_54;
  long local_50;
  long local_48;
  mfcc_t **local_40;
  long local_38;
  
  lVar48 = (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24);
  local_40 = featbuf;
  memset(senone_scores,0,(long)ps[3].frame_idx * 2);
  local_54 = frame % ps[6].frame_idx;
  lVar26 = (long)local_54;
  ps[6].vt = (ps_mgaufuncs_t *)(&(ps[5].vt)->name)[lVar26];
  local_38 = lVar48;
  if (0 < lVar48) {
    uVar23 = (ulong)(uint)n_senone_active;
    lVar48 = 0;
    do {
      if (ps->frame_idx <= frame) {
        lVar24 = lVar26;
        if (local_54 == 0) {
          lVar24 = (long)ps[6].frame_idx;
        }
        memcpy((&(ps[6].vt)->name)[lVar48],
               *(void **)(*(long *)((long)ps[5].vt + lVar24 * 8 + -8) + lVar48 * 8),
               (long)(short)ps[4].frame_idx << 3);
        pmVar10 = local_40[lVar48];
        if (0 < (short)ps[4].frame_idx) {
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          iVar32 = *(int *)(*(long *)(*(long *)&ps[1].frame_idx + 0x30) + lVar48 * 4);
          uVar35 = 0;
          do {
            iVar34 = *(int *)(pcVar11 + uVar35 * 8 + 4);
            puVar12 = *(undefined8 **)&ps[1].frame_idx;
            fVar49 = *(float *)(*(long *)(*(long *)puVar12[2] + lVar48 * 8) + (long)iVar34 * 4);
            if (0 < iVar32) {
              lVar24 = (long)(iVar34 * iVar32) * 4;
              lVar39 = 0;
              do {
                fVar50 = (float)pmVar10[lVar39] -
                         *(float *)(lVar24 + **(long **)(*(long *)*puVar12 + lVar48 * 8) +
                                   lVar39 * 4);
                fVar49 = fVar49 - fVar50 * fVar50 *
                                  *(float *)(**(long **)(*(long *)puVar12[1] + lVar48 * 8) + lVar24
                                            + lVar39 * 4);
                lVar39 = lVar39 + 1;
              } while (iVar32 != (int)lVar39);
            }
            fVar50 = -2.1474836e+09;
            if (-2.1474836e+09 <= fVar49) {
              fVar50 = fVar49;
            }
            iVar37 = (int)fVar50;
            *(int *)(pcVar11 + uVar35 * 8) = iVar37;
            uVar40 = uVar35;
            if (uVar35 != 0) {
              do {
                uVar42 = uVar40 - 1 & 0xffffffff;
                if (iVar37 <= *(int *)(pcVar11 + uVar42 * 8)) goto LAB_0013e8d5;
                *(undefined8 *)(pcVar11 + uVar40 * 8) = *(undefined8 *)(pcVar11 + uVar42 * 8);
                bVar20 = 1 < (long)uVar40;
                uVar40 = uVar40 - 1;
              } while (bVar20);
              uVar40 = 0;
LAB_0013e8d5:
              *(int *)(pcVar11 + (long)(int)uVar40 * 8) = iVar37;
              *(int *)(pcVar11 + (long)(int)uVar40 * 8 + 4) = iVar34;
            }
            uVar35 = uVar35 + 1;
          } while ((long)uVar35 < (long)(short)ps[4].frame_idx);
        }
        if (frame % (int)*(short *)((long)&ps[4].frame_idx + 2) == 0) {
          puVar12 = *(undefined8 **)&ps[1].frame_idx;
          iVar32 = *(int *)(puVar12 + 5);
          if (0 < (long)iVar32) {
            piVar13 = (int *)(&(ps[6].vt)->name)[lVar48];
            sVar8 = (short)ps[4].frame_idx;
            pfVar14 = *(float **)(*(long *)puVar12[2] + lVar48 * 8);
            iVar34 = *(int *)(puVar12[6] + lVar48 * 4);
            lVar39 = **(long **)(*(long *)puVar12[1] + lVar48 * 8);
            lVar24 = **(long **)(*(long *)*puVar12 + lVar48 * 8);
            piVar15 = piVar13 + (long)sVar8 * 2 + -4;
            pfVar45 = pfVar14;
            do {
              fVar49 = *pfVar45;
              if (0 < iVar34) {
                lVar36 = 0;
                lVar31 = 0;
                do {
                  if (fVar49 < (float)piVar13[(long)sVar8 * 2 + -2]) {
                    lVar24 = (lVar24 - lVar36) + (iVar34 - lVar31) * 4;
                    lVar39 = (lVar39 - lVar36) + (iVar34 - lVar31) * 4;
                    goto LAB_0013ea61;
                  }
                  fVar50 = (float)pmVar10[lVar31] - *(float *)(lVar24 + lVar31 * 4);
                  fVar49 = fVar49 - fVar50 * fVar50 * *(float *)(lVar39 + lVar31 * 4);
                  lVar31 = lVar31 + 1;
                  lVar36 = lVar36 + -4;
                } while (iVar34 != (int)lVar31);
                lVar24 = lVar24 - lVar36;
                lVar39 = lVar39 - lVar36;
              }
              fVar50 = -2.1474836e+09;
              if (-2.1474836e+09 <= fVar49) {
                fVar50 = fVar49;
              }
              iVar37 = (int)fVar50;
              if (piVar13[(long)sVar8 * 2 + -2] <= iVar37) {
                uVar35 = (ulong)(short)ps[4].frame_idx;
                iVar29 = (int)((ulong)((long)pfVar45 - (long)pfVar14) >> 2);
                piVar22 = piVar15;
                if ((long)uVar35 < 1) {
joined_r0x0013ea39:
                  for (; (piVar13 <= piVar22 && (*piVar22 <= iVar37)); piVar22 = piVar22 + -2) {
                    *(undefined8 *)(piVar22 + 2) = *(undefined8 *)piVar22;
                  }
                  piVar22[3] = iVar29;
                  piVar22[2] = iVar37;
                }
                else if (piVar13[1] != iVar29) {
                  uVar40 = 0;
                  do {
                    if (uVar35 - 1 == uVar40) goto joined_r0x0013ea39;
                    uVar42 = uVar40 + 1;
                    lVar31 = uVar40 * 2;
                    uVar40 = uVar42;
                  } while (piVar13[lVar31 + 3] != iVar29);
                  if (uVar35 <= uVar42) goto joined_r0x0013ea39;
                }
              }
LAB_0013ea61:
              pfVar45 = pfVar45 + 1;
            } while (pfVar45 < pfVar14 + iVar32);
          }
        }
        if ((short)ps[4].frame_idx < 1) {
          lVar24 = 0;
        }
        else {
          piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
          iVar32 = *piVar15;
          lVar24 = 0;
          do {
            iVar34 = (iVar32 >> 10) - (piVar15[lVar24 * 2] >> 10);
            if (0x5f < iVar34) {
              iVar34 = 0x60;
            }
            piVar15[lVar24 * 2] = iVar34;
            bVar28 = *(byte *)((long)&(ps[4].vt)->name + lVar48);
          } while (((bVar28 == 0) || (iVar34 <= (int)(uint)bVar28)) &&
                  (lVar24 = lVar24 + 1, lVar24 < (short)ps[4].frame_idx));
        }
        *(char *)(*(long *)(*(long *)&ps[5].frame_idx + lVar26 * 8) + lVar48) = (char)lVar24;
      }
      ppVar16 = ps[3].vt;
      if (ppVar16 == (ps_mgaufuncs_t *)0x0) {
        if (compallsen == 0) {
          bVar28 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar26 * 8) + lVar48);
          switch(bVar28) {
          case 1:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)((&(ps[2].vt)->name)[lVar48] + (long)*(int *)(pcVar11 + 4) * 8);
              uVar9 = *(undefined4 *)pcVar11;
              uVar35 = 0;
              uVar40 = 0;
              do {
                uVar40 = (uVar40 & 0xffffffff) + (ulong)senone_active[uVar35];
                senone_scores[uVar40] =
                     senone_scores[uVar40] + (ushort)*(byte *)(lVar24 + uVar40) + (short)uVar9;
                uVar35 = uVar35 + 1;
              } while (uVar23 != uVar35);
            }
            break;
          case 2:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[2].vt)->name)[lVar48];
              piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
              lVar39 = *(long *)(pcVar11 + (long)piVar15[3] * 8);
              iVar32 = *piVar15;
              iVar34 = piVar15[2];
              pcVar11 = (ps[7].vt)->name;
              uVar35 = 0;
              uVar40 = 0;
              do {
                uVar40 = (uVar40 & 0xffffffff) + (ulong)senone_active[uVar35];
                iVar29 = (uint)*(byte *)(lVar24 + uVar40) + iVar32;
                iVar37 = (uint)*(byte *)(lVar39 + uVar40) + iVar34;
                uVar25 = iVar29 - iVar37;
                if (iVar29 < iVar37) {
                  iVar37 = iVar29;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                senone_scores[uVar40] =
                     senone_scores[uVar40] + ((short)iVar37 - (ushort)(byte)pcVar11[uVar38]);
                uVar35 = uVar35 + 1;
              } while (uVar23 != uVar35);
            }
            break;
          case 3:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[2].vt)->name)[lVar48];
              piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
              lVar39 = *(long *)(pcVar11 + (long)piVar15[3] * 8);
              lVar31 = *(long *)(pcVar11 + (long)piVar15[5] * 8);
              iVar32 = *piVar15;
              iVar34 = piVar15[2];
              pcVar11 = (ps[7].vt)->name;
              iVar37 = piVar15[4];
              uVar35 = 0;
              uVar40 = 0;
              do {
                uVar40 = (uVar40 & 0xffffffff) + (ulong)senone_active[uVar35];
                iVar43 = (uint)*(byte *)(lVar24 + uVar40) + iVar32;
                iVar29 = (uint)*(byte *)(lVar39 + uVar40) + iVar34;
                uVar25 = iVar43 - iVar29;
                if (iVar43 < iVar29) {
                  iVar29 = iVar43;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar29 = iVar29 - (uint)(byte)pcVar11[uVar38];
                iVar43 = (uint)*(byte *)(lVar31 + uVar40) + iVar37;
                uVar25 = iVar29 - iVar43;
                if (iVar29 < iVar43) {
                  iVar43 = iVar29;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                senone_scores[uVar40] =
                     senone_scores[uVar40] + ((short)iVar43 - (ushort)(byte)pcVar11[uVar38]);
                uVar35 = uVar35 + 1;
              } while (uVar23 != uVar35);
            }
            break;
          case 4:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[2].vt)->name)[lVar48];
              piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
              lVar39 = *(long *)(pcVar11 + (long)piVar15[3] * 8);
              lVar31 = *(long *)(pcVar11 + (long)piVar15[5] * 8);
              lVar36 = *(long *)(pcVar11 + (long)piVar15[7] * 8);
              iVar32 = *piVar15;
              iVar34 = piVar15[2];
              pcVar11 = (ps[7].vt)->name;
              iVar37 = piVar15[4];
              iVar29 = piVar15[6];
              uVar35 = 0;
              uVar40 = 0;
              do {
                uVar40 = (uVar40 & 0xffffffff) + (ulong)senone_active[uVar35];
                iVar44 = (uint)*(byte *)(lVar24 + uVar40) + iVar32;
                iVar43 = (uint)*(byte *)(lVar39 + uVar40) + iVar34;
                uVar25 = iVar44 - iVar43;
                if (iVar44 < iVar43) {
                  iVar43 = iVar44;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar43 = iVar43 - (uint)(byte)pcVar11[uVar38];
                iVar44 = (uint)*(byte *)(lVar31 + uVar40) + iVar37;
                uVar25 = iVar43 - iVar44;
                if (iVar43 < iVar44) {
                  iVar44 = iVar43;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar44 = iVar44 - (uint)(byte)pcVar11[uVar38];
                iVar43 = (uint)*(byte *)(lVar36 + uVar40) + iVar29;
                uVar25 = iVar44 - iVar43;
                if (iVar44 < iVar43) {
                  iVar43 = iVar44;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                senone_scores[uVar40] =
                     senone_scores[uVar40] + ((short)iVar43 - (ushort)(byte)pcVar11[uVar38]);
                uVar35 = uVar35 + 1;
              } while (uVar23 != uVar35);
            }
            break;
          case 5:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[2].vt)->name)[lVar48];
              piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
              lVar39 = *(long *)(pcVar11 + (long)piVar15[3] * 8);
              lVar31 = *(long *)(pcVar11 + (long)piVar15[5] * 8);
              lVar36 = *(long *)(pcVar11 + (long)piVar15[7] * 8);
              lVar18 = *(long *)(pcVar11 + (long)piVar15[9] * 8);
              iVar32 = *piVar15;
              iVar34 = piVar15[2];
              pcVar11 = (ps[7].vt)->name;
              iVar37 = piVar15[4];
              iVar29 = piVar15[6];
              iVar43 = piVar15[8];
              uVar40 = 0;
              uVar35 = 0;
              do {
                uVar35 = (uVar35 & 0xffffffff) + (ulong)senone_active[uVar40];
                iVar47 = (uint)*(byte *)(lVar24 + uVar35) + iVar32;
                iVar44 = (uint)*(byte *)(lVar39 + uVar35) + iVar34;
                uVar25 = iVar47 - iVar44;
                if (iVar47 < iVar44) {
                  iVar44 = iVar47;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar44 = iVar44 - (uint)(byte)pcVar11[uVar38];
                iVar47 = (uint)*(byte *)(lVar31 + uVar35) + iVar37;
                uVar25 = iVar44 - iVar47;
                if (iVar44 < iVar47) {
                  iVar47 = iVar44;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar47 = iVar47 - (uint)(byte)pcVar11[uVar38];
                iVar44 = (uint)*(byte *)(lVar36 + uVar35) + iVar29;
                uVar25 = iVar47 - iVar44;
                if (iVar47 < iVar44) {
                  iVar44 = iVar47;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar44 = iVar44 - (uint)(byte)pcVar11[uVar38];
                iVar47 = (uint)*(byte *)(lVar18 + uVar35) + iVar43;
                uVar25 = iVar44 - iVar47;
                if (iVar44 < iVar47) {
                  iVar47 = iVar44;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                senone_scores[uVar35] =
                     senone_scores[uVar35] + ((short)iVar47 - (ushort)(byte)pcVar11[uVar38]);
                uVar40 = uVar40 + 1;
              } while (uVar23 != uVar40);
            }
            break;
          case 6:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[2].vt)->name)[lVar48];
              piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
              lVar39 = *(long *)(pcVar11 + (long)piVar15[3] * 8);
              local_48 = *(long *)(pcVar11 + (long)piVar15[5] * 8);
              local_50 = *(long *)(pcVar11 + (long)piVar15[7] * 8);
              lVar31 = *(long *)(pcVar11 + (long)piVar15[9] * 8);
              lVar36 = *(long *)(pcVar11 + (long)piVar15[0xb] * 8);
              iVar32 = *piVar15;
              iVar34 = piVar15[2];
              pcVar11 = (ps[7].vt)->name;
              iVar37 = piVar15[4];
              iVar29 = piVar15[6];
              iVar43 = piVar15[8];
              iVar44 = piVar15[10];
              uVar35 = 0;
              uVar40 = 0;
              do {
                uVar40 = (uVar40 & 0xffffffff) + (ulong)senone_active[uVar35];
                iVar30 = (uint)*(byte *)(lVar24 + uVar40) + iVar32;
                iVar47 = (uint)*(byte *)(lVar39 + uVar40) + iVar34;
                uVar25 = iVar30 - iVar47;
                if (iVar30 < iVar47) {
                  iVar47 = iVar30;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar47 = iVar47 - (uint)(byte)pcVar11[uVar38];
                iVar30 = (uint)*(byte *)(local_48 + uVar40) + iVar37;
                uVar25 = iVar47 - iVar30;
                if (iVar47 < iVar30) {
                  iVar30 = iVar47;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar30 = iVar30 - (uint)(byte)pcVar11[uVar38];
                iVar47 = (uint)*(byte *)(local_50 + uVar40) + iVar29;
                uVar25 = iVar30 - iVar47;
                if (iVar30 < iVar47) {
                  iVar47 = iVar30;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar47 = iVar47 - (uint)(byte)pcVar11[uVar38];
                iVar30 = (uint)*(byte *)(lVar31 + uVar40) + iVar43;
                uVar25 = iVar47 - iVar30;
                if (iVar47 < iVar30) {
                  iVar30 = iVar47;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                iVar30 = iVar30 - (uint)(byte)pcVar11[uVar38];
                iVar47 = (uint)*(byte *)(lVar36 + uVar40) + iVar44;
                uVar25 = iVar30 - iVar47;
                if (iVar30 < iVar47) {
                  iVar47 = iVar30;
                }
                uVar38 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar38 = uVar25;
                }
                senone_scores[uVar40] =
                     senone_scores[uVar40] + ((short)iVar47 - (ushort)(byte)pcVar11[uVar38]);
                uVar35 = uVar35 + 1;
              } while (uVar23 != uVar35);
            }
            break;
          default:
            if (0 < n_senone_active) {
              pcVar11 = (&(ps[2].vt)->name)[lVar48];
              piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
              lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
              iVar32 = *piVar15;
              uVar35 = 0;
              uVar40 = 0;
              do {
                uVar40 = (uVar40 & 0xffffffff) + (ulong)senone_active[uVar35];
                iVar34 = (uint)*(byte *)(lVar24 + uVar40) + iVar32;
                if (1 < bVar28) {
                  lVar39 = 0;
                  do {
                    iVar37 = (uint)*(byte *)(*(long *)(pcVar11 + (long)piVar15[lVar39 * 2 + 3] * 8)
                                            + uVar40) + piVar15[lVar39 * 2 + 2];
                    uVar25 = iVar34 - iVar37;
                    if (iVar34 < iVar37) {
                      iVar37 = iVar34;
                    }
                    uVar38 = -uVar25;
                    if (0 < (int)uVar25) {
                      uVar38 = uVar25;
                    }
                    iVar34 = iVar37 - (uint)(byte)(ps[7].vt)->name[uVar38];
                    lVar39 = lVar39 + 1;
                  } while ((ulong)bVar28 - 1 != lVar39);
                }
                senone_scores[uVar40] = senone_scores[uVar40] + (short)iVar34;
                uVar35 = uVar35 + 1;
              } while (uVar35 != uVar23);
            }
          }
        }
        else {
          iVar32 = ps[3].frame_idx;
          if (0 < (long)iVar32) {
            bVar28 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar26 * 8) + lVar48);
            pcVar11 = (&(ps[2].vt)->name)[lVar48];
            piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
            iVar34 = *piVar15;
            lVar39 = 0;
            do {
              iVar37 = (uint)*(byte *)(lVar24 + lVar39) + iVar34;
              if (1 < bVar28) {
                lVar31 = 0;
                do {
                  iVar29 = (uint)*(byte *)(*(long *)(pcVar11 + (long)piVar15[lVar31 * 2 + 3] * 8) +
                                          lVar39) + piVar15[lVar31 * 2 + 2];
                  uVar25 = iVar37 - iVar29;
                  if (iVar37 < iVar29) {
                    iVar29 = iVar37;
                  }
                  uVar38 = -uVar25;
                  if (0 < (int)uVar25) {
                    uVar38 = uVar25;
                  }
                  iVar37 = iVar29 - (uint)(byte)(ps[7].vt)->name[uVar38];
                  lVar31 = lVar31 + 1;
                } while ((ulong)bVar28 - 1 != lVar31);
              }
              senone_scores[lVar39] = senone_scores[lVar39] + (short)iVar37;
              lVar39 = lVar39 + 1;
            } while (lVar39 != iVar32);
          }
        }
      }
      else if (compallsen == 0) {
        bVar28 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar26 * 8) + lVar48);
        switch(bVar28) {
        case 1:
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          cVar1 = *pcVar11;
          lVar24 = 0;
          do {
            abStack_b8[lVar24] = *(char *)((long)&ppVar16->name + lVar24) + cVar1;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x10);
          if (0 < n_senone_active) {
            lVar24 = *(long *)((&(ps[2].vt)->name)[lVar48] + (long)*(int *)(pcVar11 + 4) * 8);
            uVar35 = 0;
            uVar40 = 0;
            do {
              uVar25 = (int)uVar40 + (uint)senone_active[uVar35];
              uVar40 = (ulong)uVar25;
              bVar28 = *(byte *)(lVar24 + (ulong)(uVar25 >> 1));
              bVar27 = bVar28 >> 4;
              if ((uVar25 & 1) == 0) {
                bVar27 = bVar28 & 0xf;
              }
              senone_scores[uVar40] = senone_scores[uVar40] + (ushort)abStack_b8[bVar27];
              uVar35 = uVar35 + 1;
            } while (uVar23 != uVar35);
          }
          break;
        case 2:
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          cVar1 = *pcVar11;
          cVar2 = pcVar11[8];
          lVar24 = 0;
          do {
            cVar3 = *(char *)((long)&ppVar16->name + lVar24);
            abStack_b8[lVar24] = cVar3 + cVar1;
            abStack_a8[lVar24] = cVar3 + cVar2;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x10);
          if (0 < n_senone_active) {
            pcVar17 = (&(ps[2].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 4) * 8);
            lVar39 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0xc) * 8);
            pcVar11 = (ps[7].vt)->name;
            uVar35 = 0;
            uVar40 = 0;
            do {
              uVar25 = (int)uVar40 + (uint)senone_active[uVar35];
              uVar40 = (ulong)uVar25;
              bVar28 = *(byte *)(lVar24 + (ulong)(uVar25 >> 1));
              bVar27 = *(byte *)(lVar39 + (ulong)(uVar25 >> 1));
              bVar41 = bVar28 >> 4;
              bVar21 = bVar27 >> 4;
              if ((uVar25 & 1) == 0) {
                bVar41 = bVar28 & 0xf;
                bVar21 = bVar27 & 0xf;
              }
              bVar28 = abStack_a8[bVar21];
              uVar38 = (uint)abStack_b8[bVar41];
              uVar46 = uVar38 - bVar28;
              uVar25 = (uint)bVar28;
              if (uVar38 < bVar28) {
                uVar25 = uVar38;
              }
              uVar38 = -uVar46;
              if (0 < (int)uVar46) {
                uVar38 = uVar46;
              }
              senone_scores[uVar40] =
                   senone_scores[uVar40] + ((short)uVar25 - (ushort)(byte)pcVar11[uVar38 & 0xff]);
              uVar35 = uVar35 + 1;
            } while (uVar23 != uVar35);
          }
          break;
        case 3:
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          cVar1 = *pcVar11;
          cVar2 = pcVar11[8];
          cVar3 = pcVar11[0x10];
          lVar24 = 0;
          do {
            cVar4 = *(char *)((long)&ppVar16->name + lVar24);
            abStack_b8[lVar24] = cVar4 + cVar1;
            abStack_a8[lVar24] = cVar4 + cVar2;
            abStack_98[lVar24] = cVar4 + cVar3;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x10);
          if (0 < n_senone_active) {
            pcVar17 = (&(ps[2].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 4) * 8);
            lVar39 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0xc) * 8);
            lVar31 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x14) * 8);
            pcVar11 = (ps[7].vt)->name;
            uVar35 = 0;
            uVar25 = 0;
            do {
              uVar25 = senone_active[uVar35] + uVar25;
              uVar40 = (ulong)(uVar25 >> 1);
              if ((uVar25 & 1) == 0) {
                bVar28 = abStack_b8[*(byte *)(lVar24 + uVar40) & 0xf];
                bVar27 = abStack_a8[*(byte *)(lVar39 + uVar40) & 0xf];
                iVar32 = (uint)bVar28 - (uint)bVar27;
                if ((uint)bVar28 < (uint)bVar27) {
                  bVar27 = bVar28;
                }
                bVar28 = (byte)iVar32;
                bVar41 = -bVar28;
                if (0 < iVar32) {
                  bVar41 = bVar28;
                }
                uVar38 = (uint)bVar27 - (uint)(byte)pcVar11[bVar41];
                bVar28 = *(byte *)(lVar31 + uVar40) & 0xf;
              }
              else {
                bVar28 = abStack_b8[*(byte *)(lVar24 + uVar40) >> 4];
                bVar27 = abStack_a8[*(byte *)(lVar39 + uVar40) >> 4];
                iVar32 = (uint)bVar28 - (uint)bVar27;
                if ((uint)bVar28 < (uint)bVar27) {
                  bVar27 = bVar28;
                }
                bVar28 = (byte)iVar32;
                bVar41 = -bVar28;
                if (0 < iVar32) {
                  bVar41 = bVar28;
                }
                uVar38 = (uint)bVar27 - (uint)(byte)pcVar11[bVar41];
                bVar28 = *(byte *)(lVar31 + uVar40) >> 4;
              }
              bVar28 = abStack_98[bVar28];
              uVar33 = uVar38 - bVar28;
              uVar46 = (uint)bVar28;
              if ((int)uVar38 < (int)(uint)bVar28) {
                uVar46 = uVar38;
              }
              uVar38 = -uVar33;
              if (0 < (int)uVar33) {
                uVar38 = uVar33;
              }
              senone_scores[uVar25] =
                   senone_scores[uVar25] + ((short)uVar46 - (ushort)(byte)pcVar11[uVar38]);
              uVar35 = uVar35 + 1;
            } while (uVar23 != uVar35);
          }
          break;
        case 4:
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          cVar1 = *pcVar11;
          cVar2 = pcVar11[8];
          cVar3 = pcVar11[0x10];
          cVar4 = pcVar11[0x18];
          lVar24 = 0;
          do {
            cVar5 = *(char *)((long)&ppVar16->name + lVar24);
            abStack_b8[lVar24] = cVar5 + cVar1;
            abStack_a8[lVar24] = cVar5 + cVar2;
            abStack_98[lVar24] = cVar5 + cVar3;
            abStack_88[lVar24] = cVar5 + cVar4;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x10);
          if (0 < n_senone_active) {
            pcVar17 = (&(ps[2].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 4) * 8);
            lVar39 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0xc) * 8);
            lVar31 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x14) * 8);
            lVar36 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x1c) * 8);
            pcVar11 = (ps[7].vt)->name;
            uVar35 = 0;
            uVar25 = 0;
            do {
              uVar25 = senone_active[uVar35] + uVar25;
              uVar40 = (ulong)(uVar25 >> 1);
              if ((uVar25 & 1) == 0) {
                bVar28 = abStack_a8[*(byte *)(lVar39 + uVar40) & 0xf];
                uVar46 = (uint)abStack_b8[*(byte *)(lVar24 + uVar40) & 0xf];
                iVar32 = uVar46 - bVar28;
                uVar38 = (uint)bVar28;
                if (uVar46 < bVar28) {
                  uVar38 = uVar46;
                }
                bVar28 = (byte)iVar32;
                bVar27 = -bVar28;
                if (0 < iVar32) {
                  bVar27 = bVar28;
                }
                uVar38 = uVar38 - (byte)pcVar11[bVar27];
                bVar28 = abStack_98[*(byte *)(lVar31 + uVar40) & 0xf];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = *(byte *)(lVar36 + uVar40) & 0xf;
              }
              else {
                bVar28 = abStack_a8[*(byte *)(lVar39 + uVar40) >> 4];
                uVar46 = (uint)abStack_b8[*(byte *)(lVar24 + uVar40) >> 4];
                iVar32 = uVar46 - bVar28;
                uVar38 = (uint)bVar28;
                if (uVar46 < bVar28) {
                  uVar38 = uVar46;
                }
                bVar28 = (byte)iVar32;
                bVar27 = -bVar28;
                if (0 < iVar32) {
                  bVar27 = bVar28;
                }
                uVar38 = uVar38 - (byte)pcVar11[bVar27];
                bVar28 = abStack_98[*(byte *)(lVar31 + uVar40) >> 4];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = *(byte *)(lVar36 + uVar40) >> 4;
              }
              bVar28 = abStack_88[bVar28];
              uVar33 = uVar38 - bVar28;
              uVar46 = (uint)bVar28;
              if ((int)uVar38 < (int)(uint)bVar28) {
                uVar46 = uVar38;
              }
              uVar38 = -uVar33;
              if (0 < (int)uVar33) {
                uVar38 = uVar33;
              }
              senone_scores[uVar25] =
                   senone_scores[uVar25] + ((short)uVar46 - (ushort)(byte)pcVar11[uVar38]);
              uVar35 = uVar35 + 1;
            } while (uVar23 != uVar35);
          }
          break;
        case 5:
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          cVar1 = *pcVar11;
          cVar2 = pcVar11[8];
          cVar3 = pcVar11[0x10];
          cVar4 = pcVar11[0x18];
          cVar5 = pcVar11[0x20];
          lVar24 = 0;
          do {
            cVar6 = *(char *)((long)&ppVar16->name + lVar24);
            abStack_b8[lVar24] = cVar6 + cVar1;
            abStack_a8[lVar24] = cVar6 + cVar2;
            abStack_98[lVar24] = cVar6 + cVar3;
            abStack_88[lVar24] = cVar6 + cVar4;
            abStack_78[lVar24] = cVar6 + cVar5;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x10);
          if (0 < n_senone_active) {
            pcVar17 = (&(ps[2].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 4) * 8);
            lVar39 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0xc) * 8);
            lVar31 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x14) * 8);
            lVar36 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x1c) * 8);
            lVar18 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x24) * 8);
            pcVar11 = (ps[7].vt)->name;
            uVar35 = 0;
            uVar25 = 0;
            do {
              uVar25 = senone_active[uVar35] + uVar25;
              uVar40 = (ulong)(uVar25 >> 1);
              if ((uVar25 & 1) == 0) {
                bVar28 = abStack_b8[*(byte *)(lVar24 + uVar40) & 0xf];
                bVar27 = abStack_a8[*(byte *)(lVar39 + uVar40) & 0xf];
                uVar38 = (uint)bVar28 - (uint)bVar27;
                if ((uint)bVar28 < (uint)bVar27) {
                  bVar27 = bVar28;
                }
                uVar46 = -uVar38;
                if (0 < (int)uVar38) {
                  uVar46 = uVar38;
                }
                uVar38 = (uint)bVar27 - (uint)(byte)pcVar11[(ulong)uVar46 & 0xff];
                bVar28 = abStack_98[*(byte *)(lVar31 + uVar40) & 0xf];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = abStack_88[*(byte *)(lVar36 + uVar40) & 0xf];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = *(byte *)(lVar18 + uVar40) & 0xf;
              }
              else {
                bVar28 = abStack_b8[*(byte *)(lVar24 + uVar40) >> 4];
                bVar27 = abStack_a8[*(byte *)(lVar39 + uVar40) >> 4];
                uVar38 = (uint)bVar28 - (uint)bVar27;
                if ((uint)bVar28 < (uint)bVar27) {
                  bVar27 = bVar28;
                }
                uVar46 = -uVar38;
                if (0 < (int)uVar38) {
                  uVar46 = uVar38;
                }
                uVar38 = (uint)bVar27 - (uint)(byte)pcVar11[(ulong)uVar46 & 0xff];
                bVar28 = abStack_98[*(byte *)(lVar31 + uVar40) >> 4];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = abStack_88[*(byte *)(lVar36 + uVar40) >> 4];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = *(byte *)(lVar18 + uVar40) >> 4;
              }
              bVar28 = abStack_78[bVar28];
              uVar33 = uVar38 - bVar28;
              uVar46 = (uint)bVar28;
              if ((int)uVar38 < (int)(uint)bVar28) {
                uVar46 = uVar38;
              }
              uVar38 = -uVar33;
              if (0 < (int)uVar33) {
                uVar38 = uVar33;
              }
              senone_scores[uVar25] =
                   senone_scores[uVar25] + ((short)uVar46 - (ushort)(byte)pcVar11[uVar38]);
              uVar35 = uVar35 + 1;
            } while (uVar23 != uVar35);
          }
          break;
        case 6:
          pcVar11 = (&(ps[6].vt)->name)[lVar48];
          cVar1 = *pcVar11;
          cVar2 = pcVar11[8];
          cVar3 = pcVar11[0x10];
          cVar4 = pcVar11[0x18];
          cVar5 = pcVar11[0x20];
          cVar6 = pcVar11[0x28];
          lVar24 = 0;
          do {
            cVar7 = *(char *)((long)&ppVar16->name + lVar24);
            abStack_b8[lVar24] = cVar7 + cVar1;
            abStack_a8[lVar24] = cVar7 + cVar2;
            abStack_98[lVar24] = cVar7 + cVar3;
            abStack_88[lVar24] = cVar7 + cVar4;
            abStack_78[lVar24] = cVar7 + cVar5;
            abStack_68[lVar24] = cVar7 + cVar6;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x10);
          if (0 < n_senone_active) {
            pcVar17 = (&(ps[2].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 4) * 8);
            lVar39 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0xc) * 8);
            lVar31 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x14) * 8);
            lVar36 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x1c) * 8);
            lVar18 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x24) * 8);
            lVar19 = *(long *)(pcVar17 + (long)*(int *)(pcVar11 + 0x2c) * 8);
            pcVar11 = (ps[7].vt)->name;
            uVar35 = 0;
            uVar25 = 0;
            do {
              uVar25 = senone_active[uVar35] + uVar25;
              uVar40 = (ulong)(uVar25 >> 1);
              if ((uVar25 & 1) == 0) {
                bVar28 = abStack_b8[*(byte *)(lVar24 + uVar40) & 0xf];
                bVar27 = abStack_a8[*(byte *)(lVar39 + uVar40) & 0xf];
                uVar38 = (uint)bVar28 - (uint)bVar27;
                if ((uint)bVar28 < (uint)bVar27) {
                  bVar27 = bVar28;
                }
                uVar46 = -uVar38;
                if (0 < (int)uVar38) {
                  uVar46 = uVar38;
                }
                uVar38 = (uint)bVar27 - (uint)(byte)pcVar11[(ulong)uVar46 & 0xff];
                bVar28 = abStack_98[*(byte *)(lVar31 + uVar40) & 0xf];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = abStack_88[*(byte *)(lVar36 + uVar40) & 0xf];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = abStack_78[*(byte *)(lVar18 + uVar40) & 0xf];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = *(byte *)(lVar19 + uVar40) & 0xf;
              }
              else {
                bVar28 = abStack_b8[*(byte *)(lVar24 + uVar40) >> 4];
                bVar27 = abStack_a8[*(byte *)(lVar39 + uVar40) >> 4];
                uVar38 = (uint)bVar28 - (uint)bVar27;
                if ((uint)bVar28 < (uint)bVar27) {
                  bVar27 = bVar28;
                }
                uVar46 = -uVar38;
                if (0 < (int)uVar38) {
                  uVar46 = uVar38;
                }
                uVar38 = (uint)bVar27 - (uint)(byte)pcVar11[(ulong)uVar46 & 0xff];
                bVar28 = abStack_98[*(byte *)(lVar31 + uVar40) >> 4];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = abStack_88[*(byte *)(lVar36 + uVar40) >> 4];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = abStack_78[*(byte *)(lVar18 + uVar40) >> 4];
                uVar46 = uVar38 - bVar28;
                if ((int)(uint)bVar28 <= (int)uVar38) {
                  uVar38 = (uint)bVar28;
                }
                uVar33 = -uVar46;
                if (0 < (int)uVar46) {
                  uVar33 = uVar46;
                }
                uVar38 = uVar38 - (byte)pcVar11[uVar33];
                bVar28 = *(byte *)(lVar19 + uVar40) >> 4;
              }
              bVar28 = abStack_68[bVar28];
              uVar33 = uVar38 - bVar28;
              uVar46 = (uint)bVar28;
              if ((int)uVar38 < (int)(uint)bVar28) {
                uVar46 = uVar38;
              }
              uVar38 = -uVar33;
              if (0 < (int)uVar33) {
                uVar38 = uVar33;
              }
              senone_scores[uVar25] =
                   senone_scores[uVar25] + ((short)uVar46 - (ushort)(byte)pcVar11[uVar38]);
              uVar35 = uVar35 + 1;
            } while (uVar23 != uVar35);
          }
          break;
        default:
          if (0 < n_senone_active) {
            pcVar11 = (&(ps[2].vt)->name)[lVar48];
            piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
            lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
            iVar32 = *piVar15;
            uVar35 = 0;
            uVar25 = 0;
            do {
              uVar25 = senone_active[uVar35] + uVar25;
              bVar27 = *(byte *)(lVar24 + (ulong)(uVar25 >> 1));
              bVar41 = bVar27 >> 4;
              if ((uVar25 & 1) == 0) {
                bVar41 = bVar27 & 0xf;
              }
              iVar34 = (uint)*(byte *)((long)&ppVar16->name + (ulong)bVar41) + iVar32;
              if (1 < bVar28) {
                lVar39 = 0;
                do {
                  bVar27 = *(byte *)(*(long *)(pcVar11 + (long)piVar15[lVar39 * 2 + 3] * 8) +
                                    (ulong)(uVar25 >> 1));
                  bVar41 = bVar27 >> 4;
                  if ((uVar25 & 1) == 0) {
                    bVar41 = bVar27 & 0xf;
                  }
                  iVar37 = (uint)*(byte *)((long)&ppVar16->name + (ulong)bVar41) +
                           piVar15[lVar39 * 2 + 2];
                  uVar38 = iVar34 - iVar37;
                  if (iVar34 < iVar37) {
                    iVar37 = iVar34;
                  }
                  uVar46 = -uVar38;
                  if (0 < (int)uVar38) {
                    uVar46 = uVar38;
                  }
                  iVar34 = iVar37 - (uint)(byte)(ps[7].vt)->name[uVar46];
                  lVar39 = lVar39 + 1;
                } while ((ulong)bVar28 - 1 != lVar39);
              }
              senone_scores[uVar25] = senone_scores[uVar25] + (short)iVar34;
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar23);
          }
        }
      }
      else {
        uVar25 = ps[3].frame_idx & 0xfffffffe;
        if (0 < (int)uVar25) {
          bVar28 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar26 * 8) + lVar48);
          pcVar11 = (&(ps[2].vt)->name)[lVar48];
          piVar15 = (int *)(&(ps[6].vt)->name)[lVar48];
          lVar24 = *(long *)(pcVar11 + (long)piVar15[1] * 8);
          iVar32 = *piVar15;
          uVar35 = 0;
          do {
            bVar27 = *(byte *)(lVar24 + (uVar35 >> 1));
            iVar37 = (uint)*(byte *)((long)&ppVar16->name + (ulong)(bVar27 & 0xf)) + iVar32;
            iVar34 = (uint)*(byte *)((long)&ppVar16->name + (ulong)(bVar27 >> 4)) + iVar32;
            if (1 < bVar28) {
              pcVar17 = (ps[7].vt)->name;
              lVar39 = 0;
              do {
                bVar27 = *(byte *)(*(long *)(pcVar11 + (long)piVar15[lVar39 * 2 + 3] * 8) +
                                  (uVar35 >> 1));
                iVar29 = (uint)*(byte *)((long)&ppVar16->name + (ulong)(bVar27 & 0xf)) +
                         piVar15[lVar39 * 2 + 2];
                iVar43 = (uint)*(byte *)((long)&ppVar16->name + (ulong)(bVar27 >> 4)) +
                         piVar15[lVar39 * 2 + 2];
                uVar38 = iVar37 - iVar29;
                if (iVar37 < iVar29) {
                  iVar29 = iVar37;
                }
                uVar46 = -uVar38;
                if (0 < (int)uVar38) {
                  uVar46 = uVar38;
                }
                iVar37 = iVar29 - (uint)(byte)pcVar17[uVar46];
                uVar38 = iVar34 - iVar43;
                if (iVar34 < iVar43) {
                  iVar43 = iVar34;
                }
                uVar46 = -uVar38;
                if (0 < (int)uVar38) {
                  uVar46 = uVar38;
                }
                iVar34 = iVar43 - (uint)(byte)pcVar17[uVar46];
                lVar39 = lVar39 + 1;
              } while ((ulong)bVar28 - 1 != lVar39);
            }
            senone_scores[uVar35] = senone_scores[uVar35] + (short)iVar37;
            senone_scores[uVar35 + 1] = senone_scores[uVar35 + 1] + (short)iVar34;
            uVar35 = uVar35 + 2;
          } while (uVar35 < uVar25);
        }
      }
      lVar48 = lVar48 + 1;
    } while (lVar48 != local_38);
  }
  return 0;
}

Assistant:

int32
s2_semi_mgau_frame_eval(ps_mgau_t *ps,
                        int16 *senone_scores,
                        uint8 *senone_active,
                        int32 n_senone_active,
			mfcc_t ** featbuf, int32 frame,
			int32 compallsen)
{
    s2_semi_mgau_t *s = (s2_semi_mgau_t *)ps;
    int i, topn_idx;
    int n_feat = s->g->n_feat;

    memset(senone_scores, 0, s->n_sen * sizeof(*senone_scores));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= ps_mgau_base(ps)->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        if (s->mixw_cb) {
            if (compallsen)
                get_scores_4b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_4b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
        else {
            if (compallsen)
                get_scores_8b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
    }

    return 0;
}